

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<QStyle::SubControl,_QRect> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_>::findNode<QStyle::SubControl>
          (Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *this,SubControl *key)

{
  byte bVar1;
  ulong uVar2;
  Node<QStyle::SubControl,_QRect> *pNVar3;
  Bucket BVar4;
  
  uVar2 = (this->seed >> 0x20 ^ (ulong)*key ^ this->seed) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<QStyle::SubControl>(this,key,uVar2 >> 0x20 ^ uVar2);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar3 = (Node<QStyle::SubControl,_QRect> *)0x0;
  }
  else {
    pNVar3 = (Node<QStyle::SubControl,_QRect> *)
             (((BVar4.span)->entries->storage).data + (uint)bVar1 * 0x14);
  }
  return pNVar3;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }